

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::Taskflow(Taskflow *this,Taskflow *rhs)

{
  long in_RSI;
  FlowBuilder *in_RDI;
  scoped_lock<std::mutex> lock;
  string *this_00;
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  *this_01;
  
  this_01 = (queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
             *)(in_RDI + 10);
  FlowBuilder::FlowBuilder(in_RDI,(Graph *)this_01);
  std::mutex::mutex((mutex *)0x15f2a7);
  this_00 = (string *)(in_RDI + 6);
  std::__cxx11::string::string(this_00);
  Graph::Graph((Graph *)0x15f2c3);
  std::
  queue<std::shared_ptr<tf::Topology>,std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>>
  ::
  queue<std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>,void>
            (this_01);
  std::optional<std::_List_iterator<tf::Taskflow>_>::optional
            ((optional<std::_List_iterator<tf::Taskflow>_> *)0x15f2e9);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)this_01,(mutex_type *)this_00);
  std::__cxx11::string::operator=((string *)(in_RDI + 6),(string *)(in_RSI + 0x30));
  Graph::operator=((Graph *)this_01,(Graph *)this_00);
  std::
  queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
  ::operator=(this_01,(queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
                       *)this_00);
  in_RDI[0x17]._graph = *(Graph **)(in_RSI + 0xb8);
  in_RDI[0x18]._graph = *(Graph **)(in_RSI + 0xc0);
  std::optional<std::_List_iterator<tf::Taskflow>_>::reset
            ((optional<std::_List_iterator<tf::Taskflow>_> *)0x15f37a);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x15f384);
  return;
}

Assistant:

inline Taskflow::Taskflow(Taskflow&& rhs) : FlowBuilder{_graph} {

  std::scoped_lock<std::mutex> lock(rhs._mutex);

  _name = std::move(rhs._name);
  _graph = std::move(rhs._graph);
  _topologies = std::move(rhs._topologies);
  _satellite = rhs._satellite;

  rhs._satellite.reset();
}